

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void disas_simd_tb(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar1;
  uintptr_t o_3;
  TCGTemp *pTVar2;
  TCGTemp *pTVar3;
  TCGv_i32 pTVar4;
  TCGv_i32 pTVar5;
  long lVar6;
  TCGTemp *ts;
  uintptr_t o;
  long lVar7;
  TCGTemp *ts_00;
  uint rd;
  uint uVar8;
  uintptr_t o_1;
  uintptr_t o_2;
  uint local_90;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  if ((insn & 0xc00000) != 0) {
    unallocated_encoding_aarch64(s);
    return;
  }
  if (s->fp_access_checked != true) {
    s_00 = s->uc->tcg_ctx;
    s->fp_access_checked = true;
    if (s->fp_excp_el != 0) {
      gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
      return;
    }
    rd = insn & 0x1f;
    pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    lVar7 = (long)pTVar2 - (long)s_00;
    pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    if ((insn >> 0xc & 1) == 0) {
      tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i64,(TCGArg)pTVar2,0);
    }
    else {
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(long)pTVar1 + lVar7,
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)(rd * 0x100 + 0xc10));
    }
    lVar6 = (long)pTVar3 - (long)s_00;
    local_90 = insn >> 0xd & 3;
    if ((~insn & 0x40001000) == 0) {
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(long)pTVar1 + lVar6,
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)(rd * 0x100 + 0xc18));
    }
    else {
      tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i64,(TCGArg)pTVar3,0);
    }
    pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    pTVar4 = tcg_const_i32_aarch64(s_00,insn >> 5 & 0x1f);
    pTVar5 = tcg_const_i32_aarch64(s_00,local_90 + 1);
    pTVar1 = s->uc->tcg_ctx;
    uVar8 = insn >> 8 & 0x1f00;
    tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(long)pTVar1 + ((long)pTVar2 - (long)s_00),
                        (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)(uVar8 + 0xc10));
    local_58 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
    pTVar3 = (TCGTemp *)(lVar7 + (long)s_00);
    ts = (TCGTemp *)(pTVar4 + (long)s_00);
    ts_00 = (TCGTemp *)(pTVar5 + (long)s_00);
    local_50 = pTVar3;
    local_48 = pTVar2;
    local_40 = ts;
    local_38 = ts_00;
    tcg_gen_callN_aarch64(s_00,helper_simd_tbl_aarch64,pTVar3,5,&local_58);
    if ((insn >> 0x1e & 1) != 0) {
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,((long)pTVar2 - (long)s_00) + (long)pTVar1,
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)(uVar8 + 0xc18));
      local_58 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
      local_50 = (TCGTemp *)((long)s_00 + lVar6);
      local_48 = pTVar2;
      local_40 = ts;
      local_38 = ts_00;
      tcg_gen_callN_aarch64(s_00,helper_simd_tbl_aarch64,local_50,5,&local_58);
    }
    tcg_temp_free_internal_aarch64(s_00,pTVar2);
    tcg_temp_free_internal_aarch64(s_00,ts);
    tcg_temp_free_internal_aarch64(s_00,ts_00);
    pTVar1 = s->uc->tcg_ctx;
    tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i64,lVar7 + (long)pTVar1,
                        (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)(rd * 0x100 + 0xc10));
    tcg_temp_free_internal_aarch64(s_00,pTVar3);
    pTVar1 = s->uc->tcg_ctx;
    tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i64,(long)pTVar1 + lVar6,
                        (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)(rd * 0x100 + 0xc18));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(lVar6 + (long)s_00));
    clear_vec_high(s,true,rd);
    return;
  }
  __assert_fail("!s->fp_access_checked",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                ,0x487,"_Bool fp_access_check(DisasContext *)");
}

Assistant:

static void disas_simd_tb(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int op2 = extract32(insn, 22, 2);
    int is_q = extract32(insn, 30, 1);
    int rm = extract32(insn, 16, 5);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    int is_tblx = extract32(insn, 12, 1);
    int len = extract32(insn, 13, 2);
    TCGv_i64 tcg_resl, tcg_resh, tcg_idx;
    TCGv_i32 tcg_regno, tcg_numregs;

    if (op2 != 0) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    /* This does a table lookup: for every byte element in the input
     * we index into a table formed from up to four vector registers,
     * and then the output is the result of the lookups. Our helper
     * function does the lookup operation for a single 64 bit part of
     * the input.
     */
    tcg_resl = tcg_temp_new_i64(tcg_ctx);
    tcg_resh = tcg_temp_new_i64(tcg_ctx);

    if (is_tblx) {
        read_vec_element(s, tcg_resl, rd, 0, MO_64);
    } else {
        tcg_gen_movi_i64(tcg_ctx, tcg_resl, 0);
    }
    if (is_tblx && is_q) {
        read_vec_element(s, tcg_resh, rd, 1, MO_64);
    } else {
        tcg_gen_movi_i64(tcg_ctx, tcg_resh, 0);
    }

    tcg_idx = tcg_temp_new_i64(tcg_ctx);
    tcg_regno = tcg_const_i32(tcg_ctx, rn);
    tcg_numregs = tcg_const_i32(tcg_ctx, len + 1);
    read_vec_element(s, tcg_idx, rm, 0, MO_64);
    gen_helper_simd_tbl(tcg_ctx, tcg_resl, tcg_ctx->cpu_env, tcg_resl, tcg_idx,
                        tcg_regno, tcg_numregs);
    if (is_q) {
        read_vec_element(s, tcg_idx, rm, 1, MO_64);
        gen_helper_simd_tbl(tcg_ctx, tcg_resh, tcg_ctx->cpu_env, tcg_resh, tcg_idx,
                            tcg_regno, tcg_numregs);
    }
    tcg_temp_free_i64(tcg_ctx, tcg_idx);
    tcg_temp_free_i32(tcg_ctx, tcg_regno);
    tcg_temp_free_i32(tcg_ctx, tcg_numregs);

    write_vec_element(s, tcg_resl, rd, 0, MO_64);
    tcg_temp_free_i64(tcg_ctx, tcg_resl);
    write_vec_element(s, tcg_resh, rd, 1, MO_64);
    tcg_temp_free_i64(tcg_ctx, tcg_resh);
    clear_vec_high(s, true, rd);
}